

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O1

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_EQ_COLLECTIONS_Test::Body
          (iu_SyntaxTest_x_iutest_x_EQ_COLLECTIONS_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int *in_stack_fffffffffffffda0;
  allocator<char> local_251;
  AssertionResult iutest_ar;
  AssertionHelper local_228;
  int a [5];
  int local_1e4 [3];
  int b [5];
  int local_1c4 [3];
  undefined1 local_1b8 [392];
  
  a[0] = 0;
  a[1] = 1;
  a[2] = 2;
  a[3] = 3;
  a[4] = 4;
  b[0] = 0;
  b[1] = 1;
  b[2] = 2;
  b[3] = 3;
  b[4] = 4;
  iuutil::CmpHelperEqCollections<int*,int*>
            (&iutest_ar,(iuutil *)0x33f6fe,"a+(sizeof(a)/sizeof(a[0]))","b",
             "b+(sizeof(b)/sizeof(b[0]))",(char *)a,local_1e4,b,local_1c4,in_stack_fffffffffffffda0)
  ;
  bVar2 = iutest_ar.m_result;
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 5;
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1b8,(int *)&local_228);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,iutest_ar.m_message._M_dataplus._M_p,&local_251);
    local_228.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
    ;
    local_228.m_part_result.super_iuCodeMessage.m_line = 0x6e;
    local_228.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_228,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_228.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_228.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    in_stack_fffffffffffffda0 = (int *)0x2ec3cb;
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iutest_ar.m_message._M_dataplus._M_p != &iutest_ar.m_message.field_2) {
    in_stack_fffffffffffffda0 = (int *)0x2ec3e6;
    operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                    iutest_ar.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    iuutil::CmpHelperEqCollections<int*,int*>
              (&iutest_ar,(iuutil *)0x33f6fe,"a+(sizeof(a)/sizeof(a[0]))","b",
               "b+(sizeof(b)/sizeof(b[0]))",(char *)a,local_1e4,b,local_1c4,
               in_stack_fffffffffffffda0);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 5;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1b8,(int *)&local_228);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,iutest_ar.m_message._M_dataplus._M_p,&local_251);
      local_228.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_228.m_part_result.super_iuCodeMessage.m_line = 0x70;
      local_228.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_228,(Fixed *)local_1b8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_228.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_228.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      in_stack_fffffffffffffda0 = (int *)0x2ec4e9;
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    paVar1 = &iutest_ar.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      in_stack_fffffffffffffda0 = (int *)0x2ec504;
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
    iuutil::CmpHelperEqCollections<int*,int*>
              (&iutest_ar,(iuutil *)0x33f6fe,"a+(sizeof(a)/sizeof(a[0]))","b",
               "b+(sizeof(b)/sizeof(b[0]))",(char *)a,local_1e4,b,local_1c4,
               in_stack_fffffffffffffda0);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 5;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1b8,(int *)&local_228);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,iutest_ar.m_message._M_dataplus._M_p,&local_251);
      local_228.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_228.m_part_result.super_iuCodeMessage.m_line = 0x72;
      local_228.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_228,(Fixed *)local_1b8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_228.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_228.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      in_stack_fffffffffffffda0 = (int *)0x2ec5fe;
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      in_stack_fffffffffffffda0 = (int *)0x2ec615;
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
    iuutil::CmpHelperEqCollections<int*,int*>
              (&iutest_ar,(iuutil *)0x33f6fe,"a+(sizeof(a)/sizeof(a[0]))","b",
               "b+(sizeof(b)/sizeof(b[0]))",(char *)a,local_1e4,b,local_1c4,
               in_stack_fffffffffffffda0);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 5;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1b8,(int *)&local_228);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,iutest_ar.m_message._M_dataplus._M_p,&local_251);
      local_228.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_228.m_part_result.super_iuCodeMessage.m_line = 0x74;
      local_228.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed(&local_228,(Fixed *)local_1b8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_228.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_228.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_228.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

IUTEST(SyntaxTest, EQ_COLLECTIONS)
{
    int a[] = { 0, 1, 2, 3, 4 };
    int b[] = { 0, 1, 2, 3, 4 };

    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_ASSERT_EQ_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_EXPECT_EQ_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_INFORM_EQ_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        IUTEST_ASSUME_EQ_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
}